

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_client_new3
              (nghttp2_session **session_ptr,nghttp2_session_callbacks *callbacks,void *user_data,
              nghttp2_option *option,nghttp2_mem *mem)

{
  nghttp2_session *local_48;
  nghttp2_session *session;
  nghttp2_mem *pnStack_38;
  int rv;
  nghttp2_mem *mem_local;
  nghttp2_option *option_local;
  void *user_data_local;
  nghttp2_session_callbacks *callbacks_local;
  nghttp2_session **session_ptr_local;
  
  pnStack_38 = mem;
  mem_local = (nghttp2_mem *)option;
  option_local = (nghttp2_option *)user_data;
  user_data_local = callbacks;
  callbacks_local = (nghttp2_session_callbacks *)session_ptr;
  session_ptr_local._4_4_ = session_new(&local_48,callbacks,user_data,0,option,mem);
  if (session_ptr_local._4_4_ == 0) {
    local_48->next_stream_id = 1;
    callbacks_local->send_callback = (nghttp2_send_callback)local_48;
    session_ptr_local._4_4_ = 0;
  }
  return session_ptr_local._4_4_;
}

Assistant:

int nghttp2_session_client_new3(nghttp2_session **session_ptr,
                                const nghttp2_session_callbacks *callbacks,
                                void *user_data, const nghttp2_option *option,
                                nghttp2_mem *mem) {
  int rv;
  nghttp2_session *session;

  rv = session_new(&session, callbacks, user_data, 0, option, mem);

  if (rv != 0) {
    return rv;
  }
  /* IDs for use in client */
  session->next_stream_id = 1;

  *session_ptr = session;

  return 0;
}